

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netgroup.cpp
# Opt level: O2

void __thiscall
NetGroupManager::ASMapHealthCheck
          (NetGroupManager *this,vector<CNetAddr,_std::allocator<CNetAddr>_> *clearnet_addrs)

{
  pointer pCVar1;
  string_view source_file;
  bool bVar2;
  uint32_t uVar3;
  Logger *pLVar4;
  int iVar5;
  int *in_R9;
  CNetAddr *addr;
  pointer address;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  unsigned_long local_120;
  long local_118;
  int unmapped_count;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_108 [3];
  string local_78;
  uint32_t asn;
  undefined4 uStack_54;
  size_t local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108[0]._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_108[0]._M_impl.super__Rb_tree_header._M_header;
  local_108[0]._M_impl._0_8_ = 0;
  local_108[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108[0]._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_108[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
  unmapped_count = 0;
  pCVar1 = (clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar5 = 0;
  local_108[0]._M_impl.super__Rb_tree_header._M_header._M_right =
       local_108[0]._M_impl.super__Rb_tree_header._M_header._M_left;
  for (address = (clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
                 super__Vector_impl_data._M_start; address != pCVar1; address = address + 1) {
    uVar3 = GetMappedAS(this,address);
    asn = uVar3;
    if (uVar3 == 0) {
      iVar5 = iVar5 + 1;
      unmapped_count = iVar5;
    }
    else {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)local_108,&asn);
    }
  }
  local_118 = (long)(clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(clearnet_addrs->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 5;
  local_120 = local_108[0]._M_impl.super__Rb_tree_header._M_node_count;
  pLVar4 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar4);
  if (bVar2) {
    _asn = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    tinyformat::format<unsigned_long,unsigned_long,int>
              (&local_78,
               (tinyformat *)
               "ASMap Health Check: %i clearnet peers are mapped to %i ASNs with %i peers being unmapped\n"
               ,(char *)&local_118,&local_120,(unsigned_long *)&unmapped_count,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&asn,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    pLVar4 = LogInstance();
    local_78._M_dataplus._M_p = (pointer)0x55;
    local_78._M_string_length = 0xcb2a43;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netgroup.cpp";
    source_file._M_len = 0x55;
    str._M_str = _asn;
    str._M_len = local_50;
    logging_function._M_str = "ASMapHealthCheck";
    logging_function._M_len = 0x10;
    BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x7f,ALL,Info);
    std::__cxx11::string::~string((string *)&asn);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void NetGroupManager::ASMapHealthCheck(const std::vector<CNetAddr>& clearnet_addrs) const {
    std::set<uint32_t> clearnet_asns{};
    int unmapped_count{0};

    for (const auto& addr : clearnet_addrs) {
        uint32_t asn = GetMappedAS(addr);
        if (asn == 0) {
            ++unmapped_count;
            continue;
        }
        clearnet_asns.insert(asn);
    }

    LogPrintf("ASMap Health Check: %i clearnet peers are mapped to %i ASNs with %i peers being unmapped\n", clearnet_addrs.size(), clearnet_asns.size(), unmapped_count);
}